

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharmmTorsionType.cpp
# Opt level: O1

void __thiscall
OpenMD::CharmmTorsionType::calcForce
          (CharmmTorsionType *this,RealType cosPhi,RealType *V,RealType *dVdCosPhi)

{
  DoublePolynomial *this_00;
  double dVar1;
  ulong extraout_XMM0_Qb;
  double local_48;
  double local_40;
  double local_38;
  ulong uStack_30;
  
  if (cosPhi <= 1.0) {
    local_48 = cosPhi;
    if (cosPhi < -1.0) {
      local_48 = -1.0;
    }
  }
  else {
    local_48 = 1.0;
  }
  uStack_30 = 0;
  dVar1 = 1.0 - local_48 * local_48;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
    uStack_30 = extraout_XMM0_Qb;
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  local_38 = (double)(~-(ulong)(ABS(dVar1) < 1e-06) & (ulong)dVar1 |
                     ((ulong)dVar1 & 0x8000000000000000 | 0x3eb0c6f7a0b5ed8d) &
                     -(ulong)(ABS(dVar1) < 1e-06));
  uStack_30 = uStack_30 & (~(uStack_30 & 0x7fffffffffffffff) | 0x3eb0c6f7a0b5ed8d);
  local_40 = this->C_;
  dVar1 = Polynomial<double>::evaluate(&this->T_,&local_48);
  local_40 = dVar1 + local_40;
  this_00 = &this->U_;
  dVar1 = Polynomial<double>::evaluate(this_00,&local_48);
  *V = dVar1 * local_38 + local_40;
  dVar1 = Polynomial<double>::evaluateDerivative(&this->T_,&local_48);
  *dVdCosPhi = dVar1;
  dVar1 = Polynomial<double>::evaluateDerivative(this_00,&local_48);
  *dVdCosPhi = dVar1 * local_38 + *dVdCosPhi;
  dVar1 = Polynomial<double>::evaluate(this_00,&local_48);
  *dVdCosPhi = dVar1 / (local_38 + local_38) + *dVdCosPhi;
  return;
}

Assistant:

void CharmmTorsionType::calcForce(RealType cosPhi, RealType& V,
                                    RealType& dVdCosPhi) {
    // check roundoff
    if (cosPhi > 1.0) {
      cosPhi = 1.0;
    } else if (cosPhi < -1.0) {
      cosPhi = -1.0;
    }

    RealType sinPhi = sqrt(1.0 - cosPhi * cosPhi);

    // trick to avoid divergence in angles near 0 and pi:

    if (fabs(sinPhi) < 1.0E-6) { sinPhi = copysign(1.0E-6, sinPhi); }

    V         = C_ + T_.evaluate(cosPhi) + U_.evaluate(cosPhi) * sinPhi;
    dVdCosPhi = T_.evaluateDerivative(cosPhi);
    // Chain rule for U * sinPhi term:
    dVdCosPhi += U_.evaluateDerivative(cosPhi) * sinPhi;
    dVdCosPhi += U_.evaluate(cosPhi) / (2.0 * sinPhi);
  }